

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_2::anon_unknown_0::runCoreChecks(char *filename,bool reduceMemory,bool reduceTime)

{
  ulong uVar1;
  undefined8 uVar2;
  bool reduceTime_00;
  bool reduceMemory_00;
  byte in_DL;
  byte in_SIL;
  undefined8 in_RDI;
  exr_context_initializer_t cinit;
  exr_context_t f;
  bool hadfail;
  exr_result_t rv;
  undefined1 local_90 [6];
  code *f_00;
  undefined1 local_28 [15];
  byte local_19;
  int local_18;
  byte local_12;
  byte local_11;
  undefined8 local_10;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_19 = 0;
  local_10 = in_RDI;
  memset(local_90,0,0x68);
  _local_90 = 0x68;
  f_00 = core_error_handler_cb;
  local_18 = exr_start_read(local_28,local_10,local_90);
  uVar2 = _local_90;
  if (local_18 == 0) {
    uVar1 = (ulong)_local_90 >> 0x38;
    reduceMemory_00 = SUB81(uVar1,0);
    reduceTime_00 = SUB81((ulong)uVar2 >> 0x30,0);
    _local_90 = uVar2;
    local_19 = checkCoreFile((exr_context_t)f_00,reduceMemory_00,reduceTime_00);
    exr_finish(local_28);
    local_1 = (bool)(local_19 & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
runCoreChecks (const char* filename, bool reduceMemory, bool reduceTime)
{
    exr_result_t              rv;
    bool                      hadfail = false;
    exr_context_t             f;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;

    cinit.error_handler_fn = &core_error_handler_cb;

    rv = exr_start_read (&f, filename, &cinit);
    if (rv != EXR_ERR_SUCCESS) return true;

    hadfail = checkCoreFile (f, reduceMemory, reduceTime);

    exr_finish (&f);

    return hadfail;
}